

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall args::NamedBase::~NamedBase(NamedBase *this)

{
  NamedBase *this_local;
  
  (this->super_Base)._vptr_Base = (_func_int **)&PTR__NamedBase_0013fa78;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->choicesStrings);
  std::__cxx11::string::~string((string *)&this->defaultString);
  std::__cxx11::string::~string((string *)&this->name);
  Base::~Base(&this->super_Base);
  return;
}

Assistant:

virtual ~NamedBase() {}